

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O0

void __thiscall
JointActionObservationHistory::JointActionObservationHistory
          (JointActionObservationHistory *this,PlanningUnitMADPDiscrete *pu)

{
  allocator_type *__a;
  size_t in_RSI;
  History *in_RDI;
  Index individualInitialAOHIndex;
  JointHistory *in_stack_ffffffffffffffa0;
  History *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  
  JointHistory::JointHistory(in_stack_ffffffffffffffa0);
  in_RDI->_vptr_History = (_func_int **)&PTR__JointActionObservationHistory_00d309c8;
  this_00 = in_RDI + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9b067e);
  in_RDI[3]._m_length = in_RSI;
  History::SetLength(in_RDI,0);
  in_RDI[1]._m_length = 0;
  *(undefined4 *)&in_RDI[1]._vptr_History = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_History + 4) = 0;
  __a = (allocator_type *)(**(code **)(*(long *)in_RDI[3]._m_length + 0x30))();
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9b06dd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)in_RDI,(value_type_conflict1 *)this_00,__a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9b071f);
  return;
}

Assistant:

JointActionObservationHistory::JointActionObservationHistory(PlanningUnitMADPDiscrete& pu) :
    _m_planningUnitMADPDiscrete(&pu)
{    
    SetLength(0);
    _m_pred = 0;
    _m_jaI = 0; //HARDCODED
    _m_joI = 0; 
    Index individualInitialAOHIndex = 0;//HARDCODED 
    _m_individualActionObservationHistories = vector<Index>(
            _m_planningUnitMADPDiscrete->GetNrAgents(), individualInitialAOHIndex);

}